

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFuncptrCall
          (LLVMPointerGraphBuilder *this,CallInst *CInst,Value *calledVal)

{
  PSNode *pPVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar2;
  PSNode *op;
  CallInst *local_68;
  PSNodesSeq local_60;
  PSNode *local_40;
  PSNode *local_38;
  PSNode *local_30;
  initializer_list<dg::pta::PSNode_*> local_28;
  
  local_40 = getOperand(this,calledVal);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)9,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_40);
  local_30 = PointerGraph::create<(dg::pta::PSNodeType)10>((PointerGraph *)this);
  local_30->pairedNode = pPVar1;
  pPVar1->pairedNode = local_30;
  (pPVar1->super_SubgraphNode<dg::pta::PSNode>).user_data = CInst;
  local_28._M_array = &local_38;
  local_28._M_len = 2;
  local_38 = pPVar1;
  PSNodesSeq::PSNodesSeq(&local_60,&local_28);
  if (local_60._repr == (PSNode *)0x0) {
    local_60._repr =
         local_60._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
  }
  ((local_60._repr)->super_SubgraphNode<dg::pta::PSNode>).user_data = CInst;
  local_68 = CInst;
  pVar2 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_68,&local_60);
  if (local_60._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._nodes.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (PSNodesSeq *)
         ((long)pVar2.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createFuncptrCall(const llvm::CallInst *CInst,
                                           const llvm::Value *calledVal) {
    // just the call_funcptr and call_return nodes are created and
    // when the pointers are resolved during analysis, the graph
    // will be dynamically created and it will replace these nodes
    PSNode *op = getOperand(calledVal);
    PSNode *call_funcptr = PS.create<PSNodeType::CALL_FUNCPTR>(op);
    PSNode *ret_call = PS.create<PSNodeType::CALL_RETURN>();

    ret_call->setPairedNode(call_funcptr);
    call_funcptr->setPairedNode(ret_call);

    call_funcptr->setUserData(const_cast<llvm::CallInst *>(CInst));

    return addNode(CInst, {call_funcptr, ret_call});
}